

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O3

void __thiscall
soplex::
DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
::reMax(DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
        *this,int newMax,int newSize)

{
  int n;
  
  if (-1 < newSize) {
    this->thesize = newSize;
  }
  if (newSize < newMax) {
    newSize = newMax;
  }
  n = 1;
  if (1 < newSize) {
    n = newSize;
  }
  if (n == this->themax) {
    return;
  }
  this->themax = n;
  if (0 < this->thesize) {
    spx_realloc<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::RangeType*>
              (&this->data,n);
    return;
  }
  free(this->data);
  this->data = (RangeType *)0x0;
  spx_alloc<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::RangeType*>
            (&this->data,this->themax);
  return;
}

Assistant:

void reMax(int newMax = 1, int newSize = -1)
   {
      if(newSize >= 0)
         thesize = newSize;

      if(newMax < newSize)
         newMax = newSize;

      if(newMax < 1)
         newMax = 1;

      if(newMax == themax)
         return;

      themax = newMax;

      if(thesize <= 0)
      {
         /* no data needs to be copied so do a clean free and alloc */
         spx_free(data);
         spx_alloc(data, themax);
      }
      else
         spx_realloc(data, themax);
   }